

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

int If_CluCountCofs4(word *pF,int nVars,int nBSsize,word (*pCofs) [256])

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  word local_470;
  word Mask;
  int local_450;
  int nShift;
  int nCofs;
  int c;
  int i;
  int nMints;
  word Result1;
  word Result0;
  word iCof;
  word iCofs [128];
  word (*pCofs_local) [256];
  int nBSsize_local;
  int nVars_local;
  word *pF_local;
  
  memset(&iCof,0,0x400);
  Result1 = 0;
  _i = 0;
  if (pCofs == (word (*) [256])0x0) {
    __assert_fail("pCofs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x3d7,"int If_CluCountCofs4(word *, int, int, word (*)[256])");
  }
  if (((nBSsize < 2) || (6 < nBSsize)) || (nVars <= nBSsize)) {
    __assert_fail("nBSsize >= 2 && nBSsize <= 6 && nBSsize < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x3d8,"int If_CluCountCofs4(word *, int, int, word (*)[256])");
  }
  if (5 < nVars - nBSsize) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x3f3,"int If_CluCountCofs4(word *, int, int, word (*)[256])");
  }
  iVar2 = 1 << ((char)nVars - (byte)nBSsize & 0x1f);
  bVar4 = (byte)iVar2;
  local_450 = 0;
  for (nCofs = 0; nCofs < 1 << ((byte)nBSsize & 0x1f); nCofs = nCofs + 1) {
    bVar1 = (byte)nCofs;
    uVar3 = pF[(nCofs * iVar2) / 0x40] >> (bVar1 * bVar4 & 0x3f) & (1L << (bVar4 & 0x3f)) - 1U;
    nShift = 0;
    while ((nShift < local_450 && (uVar3 != iCofs[(long)nShift + -1]))) {
      nShift = nShift + 1;
    }
    if (nShift == local_450) {
      iCofs[(long)local_450 + -1] = uVar3;
      local_450 = local_450 + 1;
    }
    if ((nShift == 1) || (nShift == 3)) {
      Result1 = 1L << (bVar1 & 0x3f) | Result1;
    }
    if ((nShift == 2) || (nShift == 3)) {
      _i = 1L << (bVar1 & 0x3f) | _i;
    }
  }
  if ((2 < local_450) && (local_450 < 5)) {
    (*pCofs)[0] = iCof;
    pCofs[1][0] = iCofs[0];
    pCofs[2][0] = iCofs[1];
    if (local_450 == 4) {
      local_470 = iCofs[2];
    }
    else {
      local_470 = iCofs[1];
    }
    pCofs[3][0] = local_470;
    pCofs[4][0] = Result1;
    pCofs[5][0] = _i;
    return local_450;
  }
  __assert_fail("nCofs >= 3 && nCofs <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                ,0x3ea,"int If_CluCountCofs4(word *, int, int, word (*)[256])");
}

Assistant:

int If_CluCountCofs4( word * pF, int nVars, int nBSsize, word pCofs[6][CLU_WRD_MAX/4] )
{
    word iCofs[128] = {0}, iCof, Result0 = 0, Result1 = 0;
    int nMints = (1 << nBSsize);
    int i, c, nCofs = 0;
    assert( pCofs );
    assert( nBSsize >= 2 && nBSsize <= 6 && nBSsize < nVars );
    if ( nVars - nBSsize < 6 )
    {
        int nShift = (1 << (nVars - nBSsize));
        word Mask  = ((((word)1) << nShift) - 1);
        for ( nCofs = i = 0; i < nMints; i++ )
        {
            iCof = (pF[(i * nShift) / 64] >> ((i * nShift) & 63)) & Mask;
            for ( c = 0; c < nCofs; c++ )
                if ( iCof == iCofs[c] )
                    break;
            if ( c == nCofs )
                iCofs[nCofs++] = iCof;
            if ( c == 1 || c == 3 )
                Result0 |= (((word)1) << i);
            if ( c == 2 || c == 3 )
                Result1 |= (((word)1) << i);
        }
        assert( nCofs >= 3 && nCofs <= 4 );
        pCofs[0][0] = iCofs[0];
        pCofs[1][0] = iCofs[1];
        pCofs[2][0] = iCofs[2];
        pCofs[3][0] = (nCofs == 4) ? iCofs[3] : iCofs[2];
        pCofs[4][0] = Result0;
        pCofs[5][0] = Result1;
    }
    else
        assert( 0 );
    return nCofs;
}